

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.cc
# Opt level: O2

char * testing::internal::ParseGoogleMockFlagValue(char *str,char *flag_name,bool def_optional)

{
  int iVar1;
  char *pcVar2;
  string flag_name_str;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (flag_name == (char *)0x0 || str == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"--gmock_",&local_69);
    std::operator+(&local_68,&local_48,flag_name);
    std::__cxx11::string::_M_dispose();
    iVar1 = strncmp(str,local_68._M_dataplus._M_p,local_68._M_string_length);
    if (iVar1 == 0) {
      pcVar2 = str + local_68._M_string_length;
      if (((!def_optional) || (str[local_68._M_string_length] != '\0')) &&
         (pcVar2 = pcVar2 + 1, str[local_68._M_string_length] != '=')) {
        pcVar2 = (char *)0x0;
      }
    }
    else {
      pcVar2 = (char *)0x0;
    }
    std::__cxx11::string::_M_dispose();
  }
  return pcVar2;
}

Assistant:

static const char* ParseGoogleMockFlagValue(const char* str,
                                            const char* flag_name,
                                            bool def_optional) {
  // str and flag must not be NULL.
  if (str == nullptr || flag_name == nullptr) return nullptr;

  // The flag must start with "--gmock_".
  const std::string flag_name_str = std::string("--gmock_") + flag_name;
  const size_t flag_name_len = flag_name_str.length();
  if (strncmp(str, flag_name_str.c_str(), flag_name_len) != 0) return nullptr;

  // Skips the flag name.
  const char* flag_end = str + flag_name_len;

  // When def_optional is true, it's OK to not have a "=value" part.
  if (def_optional && (flag_end[0] == '\0')) {
    return flag_end;
  }

  // If def_optional is true and there are more characters after the
  // flag name, or if def_optional is false, there must be a '=' after
  // the flag name.
  if (flag_end[0] != '=') return nullptr;

  // Returns the string after "=".
  return flag_end + 1;
}